

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree.cpp
# Opt level: O1

void __thiscall Segtree::Segtree(Segtree *this,int _l,int _r)

{
  Segtree *pSVar1;
  int _r_00;
  
  this->l = _l;
  this->r = _r;
  this->val = 0;
  this->lson = (Segtree *)0x0;
  this->rson = (Segtree *)0x0;
  if (1 < _r - _l) {
    _r_00 = (_r + _l) / 2;
    pSVar1 = (Segtree *)operator_new(0x20);
    Segtree(pSVar1,_l,_r_00);
    this->lson = pSVar1;
    pSVar1 = (Segtree *)operator_new(0x20);
    Segtree(pSVar1,_r_00,this->r);
    this->rson = pSVar1;
  }
  return;
}

Assistant:

Segtree (int _l, int _r) : l(_l), r(_r) {
        if (r - l > 1) {
            int mid = (l + r) / 2;
            lson = new Segtree(l, mid);
            rson = new Segtree(mid, r);
        }
    }